

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall AI::HierarchicalTaskNetworkComponent::decide(HierarchicalTaskNetworkComponent *this)

{
  Planner *plan;
  Utility *pUVar1;
  pointer pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6;
  byte bVar3;
  TaskIdentifier TVar4;
  World *this_00;
  GameMode *this_01;
  TaskDatabase *taskDatabase;
  mapped_type *pmVar5;
  int iVar6;
  Utility *pUVar7;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff1c [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48 [32];
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  taskDatabase = GameMode::getAvailableTasks(this_01);
  plan = &this->planner;
  if (((this->planner).plan.finished == false) &&
     ((this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if ((this->planner).plan.failed != true) {
      if ((((this->state).memory.sensoryMemory.
            super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->state).memory.sensoryMemory.
            super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
            super__Vector_impl_data._M_finish) ||
          (TVar4 = evaluateNeeds(this), 4 < TVar4 - React_Dismiss)) ||
         (this->currentGoal == TVar4 && this->currentGoal - React_Dismiss < 5)) goto LAB_00138fa6;
      Actor::getName_abi_cxx11_(&local_a8,(this->super_Component).owner);
      pmVar5 = std::
               map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
               ::operator[](&taskDatabase->tasks,&this->currentGoal);
      std::__cxx11::string::string((string *)&local_c8,(string *)&pmVar5->debugName);
      pmVar5 = std::
               map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
               ::operator[](&taskDatabase->tasks,(key_type *)&stack0xffffffffffffff18);
      std::__cxx11::string::string(local_48,(string *)&pmVar5->debugName);
      params_6._M_string_length = in_stack_ffffffffffffff10;
      params_6._M_dataplus._M_p = (pointer)local_48;
      params_6.field_2._M_allocated_capacity._0_4_ = TVar4;
      params_6.field_2._4_12_ = in_stack_ffffffffffffff1c;
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*,std::__cxx11::string>
                ("[",&local_a8,"] ","Aborted goal: ",&local_c8," for reaction: ",params_6);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      executeFinally(&plan->plan,&this->state);
      this->currentGoal = TVar4;
      goto LAB_00138f72;
    }
    fixFailedPlan(&plan->plan,&this->state,&(this->planner).parameters,taskDatabase);
    if ((this->planner).plan.failed != true) goto LAB_00138fa6;
    pUVar1 = (this->utilityIterator)._M_current;
    pUVar7 = pUVar1 + 1;
    (this->utilityIterator)._M_current = pUVar7;
    if ((pUVar7 == (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>.
                   _M_impl.super__Vector_impl_data._M_finish) || (pUVar1[1].score <= 0.0)) {
      createPlan(this,Null);
      pUVar7 = (Utility *)&this->currentGoal;
    }
    else {
      createPlan(this,pUVar7->task);
      pUVar7 = (this->utilityIterator)._M_current;
    }
  }
  else {
    executeFinally(&plan->plan,&this->state);
    TVar4 = evaluateNeeds(this);
    this->currentGoal = TVar4;
    Actor::getName_abi_cxx11_(&local_68,(this->super_Component).owner);
    pmVar5 = std::
             map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
             ::operator[](&taskDatabase->tasks,&this->currentGoal);
    std::__cxx11::string::string((string *)&local_88,(string *)&pmVar5->debugName);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
              ("[",&local_68,"] ","New goal: ",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
LAB_00138f72:
    updateTaskHistory(this);
    pUVar7 = (Utility *)&this->currentGoal;
    createPlan(this,*(TaskIdentifier *)pUVar7);
  }
  std::
  map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
  ::operator[](&taskDatabase->tasks,&pUVar7->task);
  std::__cxx11::string::assign((char *)&this->currentGoalName);
LAB_00138fa6:
  bVar3 = (this->planner).plan.finished;
  if (((this->planner).plan.failed == false) && (((bVar3 & 1) == 0 || (this->currentGoal != Null))))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff18,
               (((this->planner).plan.currentTask._M_current)->debugName)._M_dataplus._M_p,
               (allocator<char> *)&stack0xffffffffffffff17);
    std::__cxx11::string::operator=
              ((string *)&this->currentTaskName,(string *)&stack0xffffffffffffff18);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    bVar3 = (this->planner).plan.finished;
  }
  if (((((bVar3 & 1) != 0) && (this->currentGoal != Null)) &&
      (pTVar2 = (plan->plan).tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                super__Vector_impl_data._M_start, pTVar2->identifier != Null)) &&
     (1 < (ulong)(((long)(this->planner).plan.tasks.
                         super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pTVar2) / 0x378))) {
    decide(this);
  }
  iVar6 = 0;
  if (this->frameCount < 0x1e) {
    iVar6 = this->frameCount + 1;
  }
  this->frameCount = iVar6;
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::decide()
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();

	if (planner.plan.finished || planner.plan.tasks.empty())
	{
		executeFinally(planner.plan, state);

		currentGoal = evaluateNeeds();

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
		log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[currentGoal].debugName);
#endif

		updateTaskHistory();		

		createPlan(currentGoal);

		currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
	}	
	else if (planner.plan.failed)
	{
		fixFailedPlan(planner.plan, state, planner.parameters, tasks);

		if (planner.plan.failed)
		{
			utilityIterator++;

			if (utilityIterator != end(utilities) && utilityIterator->score > 0.f)
			{
				createPlan(utilityIterator->task);
				currentGoalName = tasks.tasks[utilityIterator->task].debugName.c_str();
			}
			else
			{
				createPlan(TaskIdentifier::Null);
				currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
			}				
		}
	}	
	else
	{
		bool abortGoal {false};
		TaskIdentifier goal {TaskIdentifier::Null};

		if (planner.plan.currentTask->action != Action::PlayMontage
			&& frameCount == 30
			&& !isReaction(currentGoal)
			&& false //TODO: consider removing the once-a-second task switch check with a emotions based check
			) //check once a second			
			//don't look for a better goal if we're currently playing a montage
		{
			//check if something higher priority can be done if we're just waiting
			goal = evaluateNeeds();

			if (goal != currentGoal)
			{
				abortGoal = true;

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[goal].debugName);
#endif

			}
		}
		else if (!state.memory.sensoryMemory.empty())
		{
			goal = evaluateNeeds();

			if (isReaction(goal))
			{
				if ((isReaction(currentGoal) && currentGoal != goal)
					|| !isReaction(currentGoal))
				{
#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
					log("[", owner->getName(), "] ", "Aborted goal: ", tasks.tasks[currentGoal].debugName, " for reaction: ", tasks.tasks[goal].debugName);
#endif

					abortGoal = true;
				}
			}
		}

		if (abortGoal)
		{
			executeFinally(planner.plan, state);

			currentGoal = goal;
			
			updateTaskHistory();			

			createPlan(currentGoal);
			/*AIOwner->StopMovement();
			AIOwner->ClearFocus(EAIFocusPriority::Gameplay);
			*/

			currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
		}
	}				
	
	if (!planner.plan.failed && (!planner.plan.finished || currentGoal != TaskIdentifier::Null))
	{
		currentTaskName = std::string(planner.plan.currentTask->debugName.c_str());
	}

	if (planner.plan.finished && currentGoal != TaskIdentifier::Null
		&& planner.plan.tasks[0].identifier != TaskIdentifier::Null
		&& planner.plan.tasks.size() > 1)
	{
		decide();
	}	

	frameCount++;

	if (frameCount > 30)
	{
		frameCount = 0;
	}
}